

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flattexture.cpp
# Opt level: O0

void __thiscall FFlatTexture::MakeTexture(FFlatTexture *this)

{
  BYTE *pBVar1;
  long lVar2;
  long numread;
  undefined1 local_48 [8];
  FWadLump lump;
  FFlatTexture *this_local;
  
  lump.Lump = (FResourceLump *)this;
  FWadCollection::OpenLumpNum((FWadLump *)local_48,&Wads,(this->super_FTexture).SourceLump);
  pBVar1 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->Pixels = pBVar1;
  lVar2 = FWadLump::Read((FWadLump *)local_48,this->Pixels,
                         (long)(int)((uint)(this->super_FTexture).Width *
                                    (uint)(this->super_FTexture).Height));
  if (lVar2 < (int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height)) {
    memset(this->Pixels + lVar2,0xbb,
           (int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height) - lVar2);
  }
  FTexture::FlipSquareBlockRemap
            (this->Pixels,(uint)(this->super_FTexture).Width,(uint)(this->super_FTexture).Height,
             GPalette.Remap);
  FWadLump::~FWadLump((FWadLump *)local_48);
  return;
}

Assistant:

void FFlatTexture::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	Pixels = new BYTE[Width*Height];
	long numread = lump.Read (Pixels, Width*Height);
	if (numread < Width*Height)
	{
		memset (Pixels + numread, 0xBB, Width*Height - numread);
	}
	FlipSquareBlockRemap (Pixels, Width, Height, GPalette.Remap);
}